

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::savedashbuffers(Forth *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  _Base_ptr p_Var3;
  string buffer;
  fstream f;
  string local_260;
  long local_240 [2];
  char local_230 [16];
  int aiStack_220 [124];
  
  std::fstream::fstream(local_240,(string *)&this->blockFileName,_S_out|_S_in|_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    p_Var3 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        if (*(char *)((long)&p_Var3[1]._M_parent + 4) == '\x01') {
          std::istream::seekg((long)local_240,(*(int *)&p_Var3[1].field_0x4 + -1) * 0x400);
          if (*(int *)((long)aiStack_220 + *(long *)(local_240[0] + -0x18)) == 0) {
            local_260._M_string_length = 0;
            local_260.field_2._M_local_buf[0] = '\0';
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            moveFromDataSpace(this,&local_260,*(Cell *)&p_Var3[1]._M_parent,0x400);
            std::ostream::write(local_230,(long)local_260._M_dataplus._M_p);
            *(undefined1 *)((long)&p_Var3[1]._M_parent + 4) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,
                              CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                       local_260.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
  }
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void savedashbuffers()
		{
			std::fstream f(blockFileName, std::ios_base::out | std::ios_base::in | std::ios_base::binary);
			if (f.is_open()) {
				for (auto& block : blocksInProcess) {
					if (block.second.blockModified) {
						f.seekg(static_cast<size_t>(block.second.blockNumber-1)*1024L, std::ios_base::beg);
						if (f.rdstate() == 0) {
							std::string buffer{};
							moveFromDataSpace(buffer, block.second.blockLocation, 1024);
							f.write(buffer.c_str(), buffer.size());
							auto statue = f.rdstate();
							auto length = f.gcount();
							statue = f.rdstate();
							block.second.blockModified = false;
						}
						auto statue = f.rdstate();
					}
				}
			}
		}